

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Glyph * __thiscall
sf::Font::getGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  byte bold_00;
  bool bVar1;
  pointer ppVar2;
  byte in_CL;
  uint in_EDX;
  Uint32 in_ESI;
  Font *in_RDI;
  float in_XMM0_Da;
  Glyph glyph;
  const_iterator it;
  Uint64 key;
  GlyphTable *glyphs;
  undefined4 in_stack_ffffffffffffff08;
  Uint32 in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff10;
  unsigned_long_long *__x;
  mapped_type *__x_00;
  map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
  *this_00;
  key_type *in_stack_ffffffffffffff48;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *in_stack_ffffffffffffff50;
  unsigned_long_long local_74 [4];
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> local_38;
  Uint64 local_30;
  mapped_type *local_28;
  Font *this_01;
  Glyph *local_8;
  
  bold_00 = in_CL & 1;
  this_01 = in_RDI;
  local_28 = std::
             map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
             ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  FT_Get_Char_Index(in_RDI->m_face,in_ESI);
  local_30 = anon_unknown.dwarf_581d0::combine
                       ((float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                        SUB81((ulong)in_stack_ffffffffffffff10 >> 0x18,0),in_stack_ffffffffffffff0c)
  ;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
       ::find((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
              (key_type_conflict *)0x12d08e);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
  _Rb_tree_const_iterator(&local_38,&local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
       ::end((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
              *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
  _Rb_tree_const_iterator(&local_48,&local_50);
  bVar1 = std::operator!=(&local_38,&local_48);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> *)
                        0x12d0fd);
  }
  else {
    __x = local_74;
    loadGlyph(this_01,in_ESI,in_EDX,(bool)bold_00,in_XMM0_Da);
    this_00 = (map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
               *)&stack0xffffffffffffff48;
    __x_00 = local_28;
    std::make_pair<unsigned_long_long&,sf::Glyph&>
              (__x,(Glyph *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::
    map<unsigned_long_long,sf::Glyph,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
    ::insert<std::pair<unsigned_long_long,sf::Glyph>>
              (this_00,(pair<unsigned_long_long,_sf::Glyph> *)__x_00);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> *)
                        0x12d1a6);
  }
  local_8 = &ppVar2->second;
  return local_8;
}

Assistant:

const Glyph& Font::getGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // Get the page corresponding to the character size
    GlyphTable& glyphs = m_pages[characterSize].glyphs;

    // Build the key by combining the glyph index (based on code point), bold flag, and outline thickness
    Uint64 key = combine(outlineThickness, bold, FT_Get_Char_Index(static_cast<FT_Face>(m_face), codePoint));

    // Search the glyph into the cache
    GlyphTable::const_iterator it = glyphs.find(key);
    if (it != glyphs.end())
    {
        // Found: just return it
        return it->second;
    }
    else
    {
        // Not found: we have to load it
        Glyph glyph = loadGlyph(codePoint, characterSize, bold, outlineThickness);
        return glyphs.insert(std::make_pair(key, glyph)).first->second;
    }
}